

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::DtlsSession::TryWrite(Error *__return_storage_ptr__,DtlsSession *this)

{
  _Elt_pointer aBuf;
  ErrorCode EVar1;
  Error *pEVar2;
  undefined1 local_58 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  EVar1 = kNone;
  while ((EVar1 == kNone &&
         (aBuf = (this->mSendQueue).c.
                 super__Deque_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur,
         (this->mSendQueue).c.
         super__Deque_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur != aBuf))) {
    Write((Error *)local_58,this,&aBuf->first,aBuf->second);
    pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_58);
    EVar1 = pEVar2->mCode;
    std::__cxx11::string::~string((string *)(local_58 + 8));
    if (EVar1 != kNone) {
      return __return_storage_ptr__;
    }
    std::
    deque<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>
    ::pop_front(&(this->mSendQueue).c);
    EVar1 = __return_storage_ptr__->mCode;
  }
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::TryWrite()
{
    Error error;
    while (error == ErrorCode::kNone && !mSendQueue.empty())
    {
        auto &messagePair = mSendQueue.front();

        SuccessOrExit(error = Write(messagePair.first, messagePair.second));
        mSendQueue.pop();
    }

exit:
    return error;
}